

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

Bool prvTidyIsAnchorElement(TidyDocImpl *doc,Node *node)

{
  TidyTagId local_28;
  TidyTagId tid;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if ((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) {
    local_28 = TidyTag_UNKNOWN;
  }
  else {
    local_28 = node->tag->id;
  }
  if ((((local_28 == TidyTag_A) || (local_28 == TidyTag_APPLET)) || (local_28 == TidyTag_FORM)) ||
     (((local_28 == TidyTag_FRAME || (local_28 == TidyTag_IFRAME)) ||
      ((local_28 == TidyTag_IMG || (local_28 == TidyTag_MAP)))))) {
    doc_local._4_4_ = yes;
  }
  else {
    doc_local._4_4_ = no;
  }
  return doc_local._4_4_;
}

Assistant:

Bool TY_(IsAnchorElement)( TidyDocImpl* ARG_UNUSED(doc), Node* node)
{
    TidyTagId tid = TagId( node );
    if ( tid == TidyTag_A      ||
         tid == TidyTag_APPLET ||
         tid == TidyTag_FORM   ||
         tid == TidyTag_FRAME  ||
         tid == TidyTag_IFRAME ||
         tid == TidyTag_IMG    ||
         tid == TidyTag_MAP )
        return yes;

    return no;
}